

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfdcapi_elements_transaction_GetTransactionData_Test::TestBody
          (cfdcapi_elements_transaction_GetTransactionData_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char *asset_value;
  uint32_t weight;
  char *wtxid;
  char *wit_hash;
  uint32_t vsize;
  char *token_value;
  AssertionResult gtest_ar;
  int ret;
  char *script_sig;
  uint32_t version;
  char *txid;
  void *handle;
  uint32_t size;
  uint32_t sequence;
  uint32_t vout;
  uint32_t txout_count;
  uint32_t locktime;
  uint32_t txin_count;
  AssertHelper local_b0;
  AssertHelper local_a8;
  AssertHelper local_a0;
  AssertHelper local_98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88;
  string local_80;
  int local_5c;
  AssertHelper local_58;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  void *local_38;
  char *local_30;
  uint32_t local_24 [5];
  
  local_38 = (void *)0x0;
  local_5c = CfdCreateHandle(&local_38);
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_48.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_80,"kCfdSuccess","ret",(CfdErrorCode *)&local_48,&local_5c);
  if ((char)local_80._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_80._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_._0_1_ = local_38 != (void *)0x0;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38 == (void *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)&local_48,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x172,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                       (char)local_80._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p) !=
        &local_80.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p));
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
      local_58.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_24[4] = 0;
  local_24[2] = 0;
  local_5c = CfdGetConfidentialTxInCount
                       (local_38,
                        "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                        ,local_24 + 4);
  local_48.ptr_ = local_48.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_80,"kCfdSuccess","ret",(CfdErrorCode *)&local_48,&local_5c);
  if ((char)local_80._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_80._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_80,"2","txin_count",(int *)&local_48,local_24 + 4);
  if ((char)local_80._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_80._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5c = CfdGetConfidentialTxOutCount
                       (local_38,
                        "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                        ,local_24 + 2);
  local_48.ptr_ = local_48.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_80,"kCfdSuccess","ret",(CfdErrorCode *)&local_48,&local_5c);
  if ((char)local_80._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_80._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_80,"4","txout_count",(int *)&local_48,local_24 + 2);
  if ((char)local_80._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_80._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x17f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58.data_ = (AssertHelperData *)0x0;
  local_24[1] = 0;
  local_24[0] = 0;
  if (local_5c == 0) {
    local_a0.data_ = (AssertHelperData *)0x0;
    local_98.data_ = (AssertHelperData *)0x0;
    local_30 = (char *)((ulong)local_30 & 0xffffffff00000000);
    local_90.ptr_ = local_90.ptr_ & 0xffffffff00000000;
    local_a8.data_ = local_a8.data_ & 0xffffffff00000000;
    local_50.data_._0_4_ = 0;
    local_24[3] = 0;
    local_5c = CfdGetConfidentialTxInfo
                         (local_38,
                          "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                          ,(char **)&local_48,(char **)&local_a0,(char **)&local_98,
                          (uint32_t *)&local_30,(uint32_t *)&local_90,(uint32_t *)&local_a8,
                          (uint32_t *)&local_50,local_24 + 3);
    local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_80,"kCfdSuccess","ret",(CfdErrorCode *)&local_b0,&local_5c);
    if ((char)local_80._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_b0);
      if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_80._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,400,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_b0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_b0.data_ + 8))();
        }
        local_b0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_80._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_5c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,
                 "\"cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992\"","txid",
                 "cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992",
                 (char *)local_48.ptr_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x192,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,
                 "\"cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992\"","wtxid",
                 "cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992",
                 (char *)local_a0.data_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x193,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,
                 "\"938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8\"","wit_hash",
                 "938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8",
                 (char *)local_98.data_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x194,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b0.data_._0_4_ = 0x200;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_80,"512","size",(int *)&local_b0,(uint *)&local_30);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x195,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b0.data_._0_4_ = 0x200;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_80,"512","vsize",(int *)&local_b0,(uint *)&local_90);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x196,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b0.data_._0_4_ = 0x800;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_80,"2048","weight",(int *)&local_b0,(uint *)&local_a8);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x197,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b0.data_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_80,"2","version",(int *)&local_b0,(uint *)&local_50);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x198,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b0.data_ = local_b0.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_80,"0","locktime",(int *)&local_b0,local_24 + 3);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x199,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (local_b0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_b0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_b0.data_ + 8))();
          }
          local_b0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_48.ptr_);
      CfdFreeStringBuffer((char *)local_a0.data_);
      CfdFreeStringBuffer((char *)local_98.data_);
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  if (local_5c == 0) {
    local_5c = CfdGetConfidentialTxIn
                         (local_38,
                          "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                          ,1,(char **)&local_48,local_24 + 1,local_24,(char **)&local_58);
    local_a0.data_ = local_a0.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_80,"kCfdSuccess","ret",(CfdErrorCode *)&local_a0,&local_5c);
    if ((char)local_80._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a0);
      if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_80._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1a4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a0.data_ + 8))();
        }
        local_a0.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_80._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_5c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,
                 "\"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f\"","txid",
                 "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",
                 (char *)local_48.ptr_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1a6,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
          local_a0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a0.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_80,"1","vout",(int *)&local_a0,local_24 + 1);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1a7,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
          local_a0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pcVar2 = "";
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,"\"\"","script_sig","",(char *)local_58.data_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((undefined8 *)local_80._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1a8,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
          local_a0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a0.data_._0_4_ = 0xffffffff;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&local_80,"4294967295U","sequence",(uint *)&local_a0,local_24);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1a9,pcVar2);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a0.data_ + 8))();
          }
          local_a0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_48.ptr_);
      CfdFreeStringBuffer((char *)local_58.data_);
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      local_58.data_ = (AssertHelperData *)0x0;
    }
  }
  if (local_5c == 0) {
    local_a0.data_ = (AssertHelperData *)0x0;
    local_98.data_ = (AssertHelperData *)0x0;
    local_b0.data_ = (AssertHelperData *)0x0;
    local_88.data_ = (AssertHelperData *)0x0;
    local_30 = (char *)0x0;
    local_90.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_5c = CfdGetTxInIssuanceInfo
                         (local_38,
                          "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                          ,1,(char **)&local_a0,(char **)&local_98,(int64_t *)&local_30,
                          (char **)&local_b0,(int64_t *)&local_90,(char **)&local_88,(char **)0x0,
                          (char **)0x0);
    local_a8.data_ = local_a8.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_80,"kCfdSuccess","ret",(CfdErrorCode *)&local_a8,&local_5c);
    if ((char)local_80._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_a8);
      if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_80._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1bb,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_a8.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_a8.data_ + 8))();
        }
        local_a8.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_80._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_5c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,
                 "\"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306\"","entropy",
                 "6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",
                 (char *)local_a0.data_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a8);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1bd,pcVar2);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_a8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a8.data_ + 8))();
          }
          local_a8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,
                 "\"0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8\"","nonce",
                 "0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8",
                 (char *)local_98.data_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a8);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1be,pcVar2);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_a8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a8.data_ + 8))();
          }
          local_a8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,"\"010000000023c34600\"","asset_value","010000000023c34600",
                 (char *)local_b0.data_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a8);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1bf,pcVar2);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_a8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a8.data_ + 8))();
          }
          local_a8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pcVar2 = "";
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,"\"\"","token_value","",(char *)local_88.data_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a8);
        if ((undefined8 *)local_80._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1c0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_a8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a8.data_ + 8))();
          }
          local_a8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a8.data_._0_4_ = 600000000;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&local_80,"600000000","asset_amount",(int *)&local_a8,(long *)&local_30
                );
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a8);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1c1,pcVar2);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_a8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a8.data_ + 8))();
          }
          local_a8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a8.data_ = local_a8.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&local_80,"0","token_amount",(int *)&local_a8,(long *)&local_90);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_a8);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1c2,pcVar2);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if (local_a8.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_a8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a8.data_ + 8))();
          }
          local_a8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_a0.data_);
      CfdFreeStringBuffer((char *)local_98.data_);
      CfdFreeStringBuffer((char *)local_b0.data_);
      CfdFreeStringBuffer((char *)local_88.data_);
    }
  }
  if (local_5c == 0) {
    local_a0.data_ = (AssertHelperData *)0x0;
    local_98.data_ = (AssertHelperData *)0x0;
    local_b0.data_ = (AssertHelperData *)0x0;
    local_88.data_ = (AssertHelperData *)0x0;
    local_30 = (char *)0x0;
    local_5c = CfdGetConfidentialTxOut
                         (local_38,
                          "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                          ,3,(char **)&local_a0,(int64_t *)&local_98,(char **)&local_b0,
                          (char **)&local_88,&local_30,(char **)0x0,(char **)0x0);
    local_90.ptr_ = local_90.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_80,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&local_5c);
    if ((char)local_80._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_80._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1d4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_90.ptr_ + 8))();
        }
        local_90.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_80._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_5c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,
                 "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"",
                 "asset_string","accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",
                 (char *)local_a0.data_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1d6,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,"\"010000000023c34600\"","value_commitment",
                 "010000000023c34600",(char *)local_b0.data_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1d7,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,
                 "\"03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879\"","nonce",
                 "03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879",
                 (char *)local_88.data_);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1d8,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_80,"\"76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac\"",
                 "locking_script","76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac",local_30);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1d9,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_90.ptr_._0_4_ = 600000000;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&local_80,"600000000","value_satoshi",(int *)&local_90,
                 (long *)&local_98);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x1da,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_a0.data_);
      CfdFreeStringBuffer((char *)local_b0.data_);
      CfdFreeStringBuffer((char *)local_88.data_);
      CfdFreeStringBuffer(local_30);
    }
  }
  local_5c = CfdGetLastErrorCode(local_38);
  if (local_5c != 0) {
    local_a0.data_ = (AssertHelperData *)0x0;
    local_5c = CfdGetLastErrorMessage(local_38,(char **)&local_a0);
    local_98.data_ = local_98.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_80,"kCfdSuccess","ret",(CfdErrorCode *)&local_98,&local_5c);
    if ((char)local_80._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_98);
      if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_80._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1e7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_98.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_98.data_ + 8))();
        }
        local_98.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_80._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_80,"\"\"","str_buffer","",(char *)local_a0.data_);
    if ((char)local_80._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_98);
      if ((undefined8 *)local_80._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_80._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x1e8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_98.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_98.data_ + 8))();
        }
        local_98.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_80._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_a0.data_);
  }
  local_5c = CfdFreeHandle(local_38);
  local_a0.data_ = local_a0.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_80,"kCfdSuccess","ret",(CfdErrorCode *)&local_a0,&local_5c);
  if ((char)local_80._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_a0);
    if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_80._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1ee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
      local_a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_80._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, GetTransactionData) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* tx_data = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  uint32_t txin_count = 0;
  uint32_t txout_count = 0;

  ret = CfdGetConfidentialTxInCount(handle, tx_data, &txin_count);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(2, txin_count);

  ret = CfdGetConfidentialTxOutCount(handle, tx_data, &txout_count);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(4, txout_count);

  char* txid = nullptr;
  char* script_sig = nullptr;
  uint32_t vout = 0;
  uint32_t sequence = 0;
  if (ret == kCfdSuccess) {
    char* wtxid = nullptr;
    char* wit_hash = nullptr;
    uint32_t size = 0;
    uint32_t vsize = 0;
    uint32_t weight = 0;
    uint32_t version = 0;
    uint32_t locktime = 0;
    ret = CfdGetConfidentialTxInfo(
        handle, tx_data, &txid, &wtxid, &wit_hash, &size, &vsize, &weight,
        &version, &locktime);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992", txid);
      EXPECT_STREQ("cf7783b2b1de646e35186df988a219a17f0317b5c3f3c47fa4ab2d7463ea3992", wtxid);
      EXPECT_STREQ("938e3a9b5bac410e812d08db74c4ef2bc58d1ed99d94b637cab0ac2e9eb59df8", wit_hash);
      EXPECT_EQ(512, size);
      EXPECT_EQ(512, vsize);
      EXPECT_EQ(2048, weight);
      EXPECT_EQ(2, version);
      EXPECT_EQ(0, locktime);

      CfdFreeStringBuffer(txid);
      CfdFreeStringBuffer(wtxid);
      CfdFreeStringBuffer(wit_hash);
      txid = nullptr;
    }
  }
  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxIn(
        handle, tx_data, 1, &txid, &vout, &sequence, &script_sig);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", txid);
      EXPECT_EQ(1, vout);
      EXPECT_STREQ("", script_sig);
      EXPECT_EQ(4294967295U, sequence);

      CfdFreeStringBuffer(txid);
      CfdFreeStringBuffer(script_sig);
      txid = nullptr;
      script_sig = nullptr;
    }
  }
  if (ret == kCfdSuccess) {
    char* entropy = nullptr;
    char* nonce = nullptr;
    char* asset_value = nullptr;
    char* token_value = nullptr;
    int64_t asset_amount = 0;
    int64_t token_amount = 0;
    ret = CfdGetTxInIssuanceInfo(
        handle, tx_data, 1, &entropy, &nonce, &asset_amount, &asset_value,
        &token_amount, &token_value, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306", entropy);
      EXPECT_STREQ("0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8", nonce);
      EXPECT_STREQ("010000000023c34600", asset_value);
      EXPECT_STREQ("", token_value);
      EXPECT_EQ(600000000, asset_amount);
      EXPECT_EQ(0, token_amount);

      CfdFreeStringBuffer(entropy);
      CfdFreeStringBuffer(nonce);
      CfdFreeStringBuffer(asset_value);
      CfdFreeStringBuffer(token_value);
    }
  }

  if (ret == kCfdSuccess) {
    char* asset_string = nullptr;
    int64_t value_satoshi = 0;
    char* value_commitment = nullptr;
    char* nonce = nullptr;
    char* locking_script = nullptr;
    ret = CfdGetConfidentialTxOut(
        handle, tx_data, 3, &asset_string, &value_satoshi, &value_commitment,
        &nonce, &locking_script, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset_string);
      EXPECT_STREQ("010000000023c34600", value_commitment);
      EXPECT_STREQ("03ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed879", nonce);
      EXPECT_STREQ("76a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac", locking_script);
      EXPECT_EQ(600000000, value_satoshi);

      CfdFreeStringBuffer(asset_string);
      CfdFreeStringBuffer(value_commitment);
      CfdFreeStringBuffer(nonce);
      CfdFreeStringBuffer(locking_script);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}